

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O2

Aig_Obj_t * Aig_TableLookupTwo(Aig_Man_t *p,Aig_Obj_t *pFanin0,Aig_Obj_t *pFanin1)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar3;
  
  pAVar2 = pFanin0;
  if (pFanin0 != pFanin1) {
    if ((Aig_Obj_t *)((ulong)pFanin1 ^ 1) == pFanin0) {
      pAVar2 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
    }
    else {
      pObj = (Aig_Obj_t *)((ulong)pFanin0 & 0xfffffffffffffffe);
      pAVar3 = p->pConst1;
      if (pAVar3 == pObj) {
        pAVar2 = pFanin1;
        if (pObj != pFanin0) {
          pAVar2 = (Aig_Obj_t *)((ulong)pFanin0 | 1);
        }
      }
      else {
        pObj_00 = (Aig_Obj_t *)((ulong)pFanin1 & 0xfffffffffffffffe);
        if (pAVar3 != pObj_00) {
          iVar1 = Aig_ObjIsConst1(pObj);
          if (iVar1 != 0) {
            __assert_fail("Type != AIG_OBJ_AND || !Aig_ObjIsConst1(Aig_Regular(p0))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x15d,
                          "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                         );
          }
          if (pFanin1 == (Aig_Obj_t *)0x0) {
            pObj_00 = (Aig_Obj_t *)0x0;
          }
          else {
            iVar1 = Aig_ObjIsConst1(pObj_00);
            if (iVar1 != 0) {
              __assert_fail("p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                            ,0x15e,
                            "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                           );
            }
          }
          if (pObj != pObj_00) {
            *(ulong *)&(p->Ghost).field_0x18 =
                 *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 5;
            if (pFanin1 == (Aig_Obj_t *)0x0) {
              pAVar2 = (Aig_Obj_t *)0x0;
              pAVar3 = pFanin0;
            }
            else {
              pAVar3 = pFanin1;
              if (pObj->Id < pObj_00->Id) {
                pAVar2 = pFanin1;
                pAVar3 = pFanin0;
              }
            }
            (p->Ghost).pFanin0 = pAVar3;
            (p->Ghost).pFanin1 = pAVar2;
            pAVar2 = Aig_TableLookup(p,&p->Ghost);
            return pAVar2;
          }
          __assert_fail("Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                        ,0x15f,
                        "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                       );
        }
        if (pAVar3 != pFanin1) {
          pAVar2 = (Aig_Obj_t *)((ulong)pAVar3 ^ 1);
        }
      }
    }
  }
  return pAVar2;
}

Assistant:

Aig_Obj_t * Aig_TableLookupTwo( Aig_Man_t * p, Aig_Obj_t * pFanin0, Aig_Obj_t * pFanin1 )
{
    Aig_Obj_t * pGhost;
    // consider simple cases
    if ( pFanin0 == pFanin1 )
        return pFanin0;
    if ( pFanin0 == Aig_Not(pFanin1) )
        return Aig_ManConst0(p);
    if ( Aig_Regular(pFanin0) == Aig_ManConst1(p) )
        return pFanin0 == Aig_ManConst1(p) ? pFanin1 : Aig_ManConst0(p);
    if ( Aig_Regular(pFanin1) == Aig_ManConst1(p) )
        return pFanin1 == Aig_ManConst1(p) ? pFanin0 : Aig_ManConst0(p);
    pGhost = Aig_ObjCreateGhost( p, pFanin0, pFanin1, AIG_OBJ_AND );
    return Aig_TableLookup( p, pGhost );
}